

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

void __thiscall
ONX_ModelTest::Internal_ReadTest
          (ONX_ModelTest *this,ON_BinaryArchive *archive,Type test_type,bool bKeepModels,
          wchar_t *text_log_file_path,ON_TextLog *text_log)

{
  ON__UINT8 *pOVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  archive_mode aVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ON_wString *src;
  ONX_Model *pOVar10;
  char *pcVar11;
  undefined7 in_register_00000009;
  ON_Buffer *pOVar12;
  uint count0_1;
  ON_SHA1_Hash *b;
  ON_TextLog *error_log;
  uint count0_3;
  uint count0;
  long lVar13;
  bool bVar14;
  ON_String read0_description;
  ON_String text_log_3dm_archive_name;
  ON_String read1_description;
  uint temporary_buffer_3dm_version [2];
  ON_String write1_description;
  shared_ptr<ONX_Model> model1_sp;
  shared_ptr<ONX_Model> model0_sp;
  ON_Buffer temporary_buffer [2];
  ON_BinaryArchiveBuffer temporary_archive;
  ON_TextLogNull devnull;
  ON_TextLog *local_3e0;
  long local_3c8;
  long local_3c0;
  ON_String local_3b8;
  ON_String local_3b0;
  undefined4 local_3a4;
  ON_String local_3a0;
  uint local_398 [2];
  ON_SHA1_Hash local_390;
  long local_378;
  ONX_ErrorCounter *local_370;
  ONX_Model *local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_360;
  ON_SHA1_Hash *local_358;
  ON_Buffer *local_350;
  ONX_Model *local_348;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_340;
  ON_Buffer local_338 [2];
  ON_BinaryArchiveBuffer local_2b0;
  ON_TextLog local_a8;
  
  local_3a4 = (undefined4)CONCAT71(in_register_00000009,bKeepModels);
  this->m_test_type = test_type;
  error_log = (ON_TextLog *)text_log_file_path;
  src = ON_BinaryArchive::ArchiveFullPath(archive);
  ON_wString::operator=(&this->m_source_3dm_file_path,src);
  ON_wString::operator=(&this->m_text_log_3dm_file_path,text_log_file_path);
  iVar4 = ON_BinaryArchive::CurrentArchiveVersion();
  ON_TextLog::ON_TextLog(&local_a8);
  local_a8._vptr_ON_TextLog = (_func_int **)&PTR__ON_TextLog_0081e4d8;
  local_3e0 = text_log;
  if (text_log == (ON_TextLog *)0x0) {
    local_3e0 = &ON_TextLog::Null;
  }
  Internal_BeginNextTest(this,Read);
  aVar5 = ON_BinaryArchive::Mode(archive);
  if (aVar5 == read3dm) {
    pOVar10 = (ONX_Model *)onmalloc(0xb88);
    ONX_Model::ONX_Model(pOVar10);
    local_348 = pOVar10;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ONX_Model*>(&local_340,pOVar10);
    if ((char)local_3a4 != '\0') {
      this->m_model[0].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_348;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&this->m_model[0].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_340);
    }
    TextLogSource3dmFilePath((ONX_ModelTest *)&local_2b0);
    ON_String::ON_String(&local_3b0,(ON_wString *)&local_2b0);
    ON_wString::~ON_wString((ON_wString *)&local_2b0);
    bVar3 = ON_String::IsEmpty(&local_3b0);
    if (bVar3) {
      ON_String::operator=(&local_3b0,"archive");
    }
    pcVar11 = ON_String::operator_cast_to_char_(&local_3b0);
    ON_String::FormatToString((char *)&local_3b8,"ONX_Model.Read(%s,...)",pcVar11);
    pcVar11 = ON_String::operator_cast_to_char_(&local_3b8);
    ON_TextLog::Print(local_3e0,"Calling %s ...\n",pcVar11);
    ON_TextLog::PushIndent(local_3e0);
    iVar6 = ON_GetErrorCount();
    iVar7 = ON_GetWarningCount();
    bVar3 = ONX_Model::Read(pOVar10,archive,0,0,error_log);
    iVar8 = ON_GetErrorCount();
    iVar9 = ON_GetWarningCount();
    this->m_model_3dm_file_version[0] = pOVar10->m_3dm_file_version;
    ON_TextLog::PopIndent(local_3e0);
    if (bVar3) {
      pcVar11 = ON_String::operator_cast_to_char_(&local_3b8);
      ON_TextLog::Print(local_3e0,"... %s ",pcVar11);
      if ((iVar8 - iVar6) + (iVar9 - iVar7) == 0) {
        ON_TextLog::Print(local_3e0,"succeeded.");
      }
      else {
        ON_TextLog::Print(local_3e0,"finished. ");
        error_log = (ON_TextLog *)(ulong)(uint)(iVar9 - iVar7);
        ON_TextLog::Print(local_3e0,"%u failures, %u errors, %u warnings",0,
                          (ulong)(uint)(iVar8 - iVar6));
      }
      ON_TextLog::PrintNewLine(local_3e0);
      ON_TextLog::PushIndent(local_3e0);
      ON_TextLog::Print(local_3e0,"Source model 3dm file version: %d",
                        (ulong)(uint)pOVar10->m_3dm_file_version);
      ON_TextLog::PrintNewLine(local_3e0);
      ONX_Model::ContentHash((ON_SHA1_Hash *)&local_2b0,pOVar10);
      *(int *)(this->m_model_hash[0].m_digest + 0x10) =
           local_2b0.super_ON_BinaryArchive.m_3dm_v1_material_index;
      *(undefined4 *)this->m_model_hash[0].m_digest =
           local_2b0.super_ON_BinaryArchive._vptr_ON_BinaryArchive._0_4_;
      *(undefined4 *)(this->m_model_hash[0].m_digest + 4) =
           local_2b0.super_ON_BinaryArchive._vptr_ON_BinaryArchive._4_4_;
      *(int *)(this->m_model_hash[0].m_digest + 8) = local_2b0.super_ON_BinaryArchive.m_3dm_version;
      *(int *)(this->m_model_hash[0].m_digest + 0xc) =
           local_2b0.super_ON_BinaryArchive.m_3dm_v1_layer_index;
      ON_TextLog::Print(local_3e0,"Source model hash: ");
      local_358 = this->m_model_hash;
      ON_SHA1_Hash::Dump(local_358,local_3e0);
      ON_TextLog::PrintNewLine(local_3e0);
      ON_TextLog::PopIndent(local_3e0);
      if (test_type != Read) {
        Internal_EndCurrentTest(this);
        Internal_BeginNextTest(this,ReadWrite);
        lVar13 = 0;
        do {
          ON_Buffer::ON_Buffer((ON_Buffer *)(local_338[0].m_reserved + lVar13 + -0x34));
          lVar13 = lVar13 + 0x40;
        } while (lVar13 != 0x80);
        local_398[0] = iVar4 - 10;
        local_370 = this->m_error_counts;
        pOVar12 = local_338;
        local_3c0 = 0;
        local_398[1] = iVar4;
        do {
          ON_BinaryArchiveBuffer::ON_BinaryArchiveBuffer(&local_2b0,write3dm,pOVar12);
          uVar2 = local_398[local_3c0];
          ON_String::FormatToString
                    ((char *)&local_390,"ONX_Model.Write( temporary_archive version %d, ...)",
                     (ulong)uVar2);
          pcVar11 = ON_String::operator_cast_to_char_((ON_String *)&local_390);
          ON_TextLog::Print(local_3e0,"Calling %s ...\n",pcVar11);
          ON_TextLog::PushIndent(local_3e0);
          iVar4 = ON_GetErrorCount();
          iVar6 = ON_GetWarningCount();
          bVar3 = ONX_Model::Write(pOVar10,&local_2b0.super_ON_BinaryArchive,uVar2,local_3e0);
          iVar7 = ON_GetErrorCount();
          iVar8 = ON_GetWarningCount();
          ON_TextLog::PopIndent(local_3e0);
          if (bVar3) {
            pcVar11 = ON_String::operator_cast_to_char_((ON_String *)&local_390);
            ON_TextLog::Print(local_3e0,"... %s ",pcVar11);
            if ((iVar7 - iVar4) + (iVar8 - iVar6) == 0) {
              ON_TextLog::Print(local_3e0,"succeeded.");
            }
            else {
              ON_TextLog::Print(local_3e0,"finished. ");
              error_log = (ON_TextLog *)(ulong)(uint)(iVar8 - iVar6);
              ON_TextLog::Print(local_3e0,"%u failures, %u errors, %u warnings",0,
                                (ulong)(uint)(iVar7 - iVar4));
            }
            ON_TextLog::PrintNewLine(local_3e0);
          }
          else {
            local_370[this->m_current_test_index].m_failure_count =
                 local_370[this->m_current_test_index].m_failure_count + 1;
            pcVar11 = ON_String::operator_cast_to_char_((ON_String *)&local_390);
            ON_TextLog::Print(local_3e0,"%s failed.\n",pcVar11);
          }
          ON_String::~ON_String((ON_String *)&local_390);
          ON_BinaryArchiveBuffer::~ON_BinaryArchiveBuffer(&local_2b0);
          bVar14 = local_3c0 == 0;
          local_3c0 = local_3c0 + 1;
          pOVar12 = pOVar12 + 1;
        } while (bVar3 && bVar14);
        if (test_type != ReadWrite) {
          Internal_EndCurrentTest(this);
          Internal_BeginNextTest(this,ReadWriteRead);
          local_378 = 0x108;
          pOVar12 = local_338;
          local_3c8 = 0x134;
          uVar2 = 1;
          lVar13 = 0;
          do {
            if (lVar13 == 8) break;
            local_350 = pOVar12;
            ON_BinaryArchiveBuffer::ON_BinaryArchiveBuffer(&local_2b0,read3dm,pOVar12);
            ON_String::FormatToString
                      ((char *)&local_3a0,"ONX_Model.Read( temporary_archive version %d, ...)",
                       (ulong)*(uint *)((long)local_398 + lVar13));
            pcVar11 = ON_String::operator_cast_to_char_(&local_3a0);
            ON_TextLog::Print(local_3e0,"Calling %s ...\n",pcVar11);
            ON_TextLog::PushIndent(local_3e0);
            pOVar10 = (ONX_Model *)onmalloc(0xb88);
            ONX_Model::ONX_Model(pOVar10);
            local_368 = pOVar10;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ONX_Model*>
                      (&local_360,pOVar10);
            if ((char)local_3a4 != '\0') {
              *(ONX_Model **)
               ((long)&this->m_model[1].super___shared_ptr<ONX_Model,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar13 * 4) = local_368;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)this->m_model_3dm_file_version + local_378 + -0x18),&local_360);
            }
            iVar4 = ON_GetErrorCount();
            iVar6 = ON_GetWarningCount();
            bVar3 = ONX_Model::Read(pOVar10,&local_2b0.super_ON_BinaryArchive,0,0,error_log);
            iVar7 = ON_GetErrorCount();
            iVar8 = ON_GetWarningCount();
            *(int *)((long)this->m_model_3dm_file_version + lVar13 + 4) =
                 pOVar10->m_3dm_file_version;
            ON_TextLog::PopIndent(local_3e0);
            if (bVar3) {
              pcVar11 = ON_String::operator_cast_to_char_(&local_3a0);
              ON_TextLog::Print(local_3e0,"... %s ",pcVar11);
              if ((iVar7 - iVar4) + (iVar8 - iVar6) == 0) {
                ON_TextLog::Print(local_3e0,"succeeded.");
              }
              else {
                ON_TextLog::Print(local_3e0,"finished. ");
                error_log = (ON_TextLog *)(ulong)(uint)(iVar8 - iVar6);
                ON_TextLog::Print(local_3e0,"%u failures, %u errors, %u warnings",0,
                                  (ulong)(uint)(iVar7 - iVar4));
              }
              ON_TextLog::PrintNewLine(local_3e0);
              ON_TextLog::PushIndent(local_3e0);
              ON_TextLog::Print(local_3e0,"Temporary model %d 3dm file version: %d",(ulong)uVar2,
                                (ulong)(uint)pOVar10->m_3dm_file_version);
              ON_TextLog::PrintNewLine(local_3e0);
              ONX_Model::ContentHash(&local_390,pOVar10);
              *(undefined4 *)((long)this->m_model_3dm_file_version + local_3c8 + -8) =
                   local_390.m_digest._16_4_;
              pOVar1 = (ON__UINT8 *)((long)this->m_model_3dm_file_version + local_3c8 + -0x18);
              *(undefined4 *)pOVar1 = local_390.m_digest._0_4_;
              *(undefined4 *)(pOVar1 + 4) = local_390.m_digest._4_4_;
              *(undefined4 *)(pOVar1 + 8) = local_390.m_digest._8_4_;
              *(undefined4 *)(pOVar1 + 0xc) = local_390.m_digest._12_4_;
              ON_TextLog::Print(local_3e0,"Temporary model %d hash: ",(ulong)uVar2);
              ON_SHA1_Hash::Dump((ON_SHA1_Hash *)
                                 ((long)this->m_model_3dm_file_version + local_3c8 + -0x18),
                                 local_3e0);
              ON_TextLog::PrintNewLine(local_3e0);
              ON_TextLog::PopIndent(local_3e0);
            }
            else {
              local_370[this->m_current_test_index].m_failure_count =
                   local_370[this->m_current_test_index].m_failure_count + 1;
              pcVar11 = ON_String::operator_cast_to_char_(&local_3a0);
              ON_TextLog::Print(local_3e0,"%s failed.\n",pcVar11);
            }
            if (local_360._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_360._M_pi);
            }
            ON_String::~ON_String(&local_3a0);
            ON_BinaryArchiveBuffer::~ON_BinaryArchiveBuffer(&local_2b0);
            lVar13 = lVar13 + 4;
            local_378 = local_378 + 0x10;
            pOVar12 = local_350 + 1;
            local_3c8 = local_3c8 + 0x14;
            uVar2 = uVar2 + 1;
          } while (bVar3);
          Internal_EndCurrentTest(this);
          Internal_BeginNextTest(this,ReadWriteReadCompare);
          b = this->m_model_hash;
          bVar3 = true;
          lVar13 = 0;
          do {
            b = b + 1;
            if ((this->m_model_3dm_file_version[0] == this->m_model_3dm_file_version[lVar13 + 1]) &&
               (this->m_model_3dm_file_version[0] == local_398[lVar13])) {
              bVar3 = ::operator!=(local_358,b);
              if (bVar3) {
                this->m_error_counts[this->m_current_test_index].m_failure_count =
                     this->m_error_counts[this->m_current_test_index].m_failure_count + 1;
                ON_TextLog::Print(local_3e0,
                                  "The source model and temporary model %d are different.\n",
                                  (ulong)((int)lVar13 + 1));
                goto LAB_0046c903;
              }
              bVar3 = false;
              ON_TextLog::Print(local_3e0,"The source model and temporary model %d are identical.\n"
                                ,lVar13 + 1);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 == 1);
          if (bVar3) {
            this->m_test_results[this->m_current_test_index] = Skip;
          }
        }
LAB_0046c903:
        lVar13 = 0x40;
        do {
          ON_Buffer::~ON_Buffer((ON_Buffer *)(local_338[0].m_reserved + lVar13 + -0x34));
          lVar13 = lVar13 + -0x40;
        } while (lVar13 != -0x40);
      }
    }
    else {
      this->m_error_counts[this->m_current_test_index].m_failure_count =
           this->m_error_counts[this->m_current_test_index].m_failure_count + 1;
      pcVar11 = ON_String::operator_cast_to_char_(&local_3b8);
      ON_TextLog::Print(local_3e0,"%s failed.\n",pcVar11);
    }
    ON_String::~ON_String(&local_3b8);
    ON_String::~ON_String(&local_3b0);
    if (local_340._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_340._M_pi);
    }
  }
  else {
    this->m_error_counts[0].m_failure_count = this->m_error_counts[0].m_failure_count + 1;
    ON_TextLog::Print(local_3e0,"archive.Mode() must be ON::archive_mode::read3dm.");
  }
  Internal_EndCurrentTest(this);
  ON_TextLog::~ON_TextLog(&local_a8);
  return;
}

Assistant:

void ONX_ModelTest::Internal_ReadTest(
  ON_BinaryArchive& archive,
  ONX_ModelTest::Type test_type,
  bool bKeepModels,
  const wchar_t* text_log_file_path,
  ON_TextLog* text_log
)
{
  m_test_type = test_type;
  m_source_3dm_file_path = archive.ArchiveFullPath();
  m_text_log_3dm_file_path = text_log_file_path;

  const unsigned int current_3dm_file_version = (unsigned int)ON_BinaryArchive::CurrentArchiveVersion();

  ON_TextLogNull devnull;
  if (nullptr == text_log)
    text_log = &ON_TextLog::Null;

  for (;;)
  {
    Internal_BeginNextTest(ONX_ModelTest::Type::Read);

    if ( ON::archive_mode::read3dm != archive.Mode() )
    {
      m_error_counts[0].IncrementFailureCount();
      text_log->Print("archive.Mode() must be ON::archive_mode::read3dm.");
      break;
    }

    ONX_Model* model0 = new ONX_Model();
    std::shared_ptr<ONX_Model> model0_sp = std::shared_ptr<ONX_Model>(model0);
    if (bKeepModels)
      this->m_model[0] = model0_sp;

    ON_String text_log_3dm_archive_name = TextLogSource3dmFilePath();
    if (text_log_3dm_archive_name.IsEmpty())
    {
      text_log_3dm_archive_name = "archive";
    }

    const ON_String read0_description
      = ON_String::FormatToString("ONX_Model.Read(%s,...)", static_cast<const char*>(text_log_3dm_archive_name));

    // read the original file
    text_log->Print("Calling %s ...\n", static_cast<const char*>(read0_description));
    text_log->PushIndent();
    ONX_ErrorCounter read0_error_counter;
    read0_error_counter.ClearLibraryErrorsAndWarnings();
    const bool bRead0 = model0->Read(archive, text_log);
    read0_error_counter.AddLibraryErrorsAndWarnings();
    m_model_3dm_file_version[0] = model0->m_3dm_file_version;

    text_log->PopIndent();

    if (false == bRead0)
    {
      m_error_counts[m_current_test_index].IncrementFailureCount();
      text_log->Print("%s failed.\n", static_cast<const char*>(read0_description));
      break;
    }
    else
    {
      text_log->Print("... %s ", static_cast<const char*>(read0_description));
      if ( 0 == read0_error_counter.TotalCount() )
        text_log->Print("succeeded.");
      else
      {
        text_log->Print("finished. ");
        read0_error_counter.Dump(*text_log);
      }
      text_log->PrintNewLine();

    }
    text_log->PushIndent();
    text_log->Print("Source model 3dm file version: %d", model0->m_3dm_file_version);
    text_log->PrintNewLine();
    m_model_hash[0] = model0->ContentHash();
    text_log->Print("Source model hash: ");
    m_model_hash[0].Dump(*text_log);
    text_log->PrintNewLine();
    text_log->PopIndent();

    if ( ONX_ModelTest::Type::Read == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWrite);

    //const unsigned int original_model_3dm_file_version = (unsigned int)(model0->m_3dm_file_version);

    // Write original_model to a termporary archive using "buffer" for storage. 
    ON_Buffer temporary_buffer[2];
    const unsigned int temporary_buffer_3dm_version[2] = { current_3dm_file_version - 10, current_3dm_file_version };

    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      ON_BinaryArchiveBuffer temporary_archive(ON::archive_mode::write3dm, &temporary_buffer[buffer_index]);

      const ON_String write1_description
        = ON_String::FormatToString(
          "ONX_Model.Write( temporary_archive version %d, ...)",
          temporary_buffer_3dm_version[buffer_index]);

      text_log->Print("Calling %s ...\n", static_cast<const char*>(write1_description));
      text_log->PushIndent();
      ONX_ErrorCounter write1_error_counter;
      write1_error_counter.ClearLibraryErrorsAndWarnings();
      bool bWrite1 = model0->Write(temporary_archive, temporary_buffer_3dm_version[buffer_index], text_log);
      write1_error_counter.AddLibraryErrorsAndWarnings();
      text_log->PopIndent();

      if (false == bWrite1)
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("%s failed.\n", static_cast<const char*>(write1_description));
        break;
      }
      else
      {
        text_log->Print("... %s ", static_cast<const char*>(write1_description));
        if ( 0 == write1_error_counter.TotalCount() )
          text_log->Print("succeeded.");
        else
        {
          text_log->Print("finished. ");
          write1_error_counter.Dump(*text_log);
        }
        text_log->PrintNewLine();
      }
    }

    // no longer need model0
    model0 = nullptr;

    if ( ONX_ModelTest::Type::ReadWrite == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWriteRead);

    // read models from the temporary archives
    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      ON_BinaryArchiveBuffer temporary_archive(ON::archive_mode::read3dm, &temporary_buffer[buffer_index]);
      const ON_String read1_description
        = ON_String::FormatToString(
          "ONX_Model.Read( temporary_archive version %d, ...)",
          temporary_buffer_3dm_version[buffer_index]);

      text_log->Print("Calling %s ...\n", static_cast<const char*>(read1_description));
      text_log->PushIndent();

      ONX_Model* model1 = new ONX_Model();
      std::shared_ptr<ONX_Model> model1_sp = std::shared_ptr<ONX_Model>(model1);
      if (bKeepModels)
        this->m_model[buffer_index+1] = model1_sp;

      ONX_ErrorCounter read1_error_counter;
      read1_error_counter.ClearLibraryErrorsAndWarnings();
      const bool bRead1 = model1->Read(temporary_archive, text_log);
      read1_error_counter.AddLibraryErrorsAndWarnings();      
      m_model_3dm_file_version[buffer_index + 1] = model1->m_3dm_file_version;

      text_log->PopIndent();

      if (false == bRead1)
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("%s failed.\n", static_cast<const char*>(read1_description));
        break;
      }
      else
      {
        text_log->Print("... %s ", static_cast<const char*>(read1_description));
        if ( 0 == read1_error_counter.TotalCount())
          text_log->Print("succeeded.");
        else
        {
          text_log->Print("finished. ");
          read1_error_counter.Dump(*text_log);
        }
        text_log->PrintNewLine();
      }
      text_log->PushIndent();
      text_log->Print("Temporary model %d 3dm file version: %d",buffer_index+1,model1->m_3dm_file_version);
      text_log->PrintNewLine();
      m_model_hash[buffer_index+1] = model1->ContentHash();
      text_log->Print("Temporary model %d hash: ",buffer_index+1);
      m_model_hash[buffer_index+1].Dump(*text_log);
      text_log->PrintNewLine();
      text_log->PopIndent();
    }

    if ( ONX_ModelTest::Type::ReadWrite == test_type)
      break;
    Internal_EndCurrentTest();
    Internal_BeginNextTest(ONX_ModelTest::Type::ReadWriteReadCompare);

    bool bSkippedCompare = true;
    for (int buffer_index = 0; buffer_index < 2; buffer_index++)
    {
      if (m_model_3dm_file_version[0] != m_model_3dm_file_version[buffer_index+1])
        continue;
      if (m_model_3dm_file_version[0] != temporary_buffer_3dm_version[buffer_index])
        continue;

      bSkippedCompare = false;
      if (m_model_hash[0] != m_model_hash[buffer_index+1])
      {
        m_error_counts[m_current_test_index].IncrementFailureCount();
        text_log->Print("The source model and temporary model %d are different.\n",buffer_index+1);
        break;
      }
      else
      {
        text_log->Print("The source model and temporary model %d are identical.\n",buffer_index+1);
      }
    }

    unsigned int compare_test_index = m_current_test_index;
    if (bSkippedCompare)
      this->m_test_results[compare_test_index] = ONX_ModelTest::Result::Skip;
            
    break;
  }

  Internal_EndCurrentTest();
}